

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

void __thiscall lodepng::ExtractZlib::~ExtractZlib(ExtractZlib *this)

{
  HuffmanTree::~HuffmanTree((HuffmanTree *)0x14661c);
  HuffmanTree::~HuffmanTree((HuffmanTree *)0x14662a);
  HuffmanTree::~HuffmanTree((HuffmanTree *)0x146638);
  return;
}

Assistant:

ExtractZlib(std::vector<ZlibBlockInfo>* info) : zlibinfo(info) {}